

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barrier.cpp
# Opt level: O0

void __thiscall Barrier::waitForFinish(Barrier *this)

{
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  condition_variable *this_00;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffd0;
  condition_variable local_18 [24];
  
  this_00 = local_18;
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
  std::condition_variable::wait<Barrier::waitForFinish()::__0>
            (this_00,in_RDI,in_stack_ffffffffffffffd0);
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void Barrier::waitForFinish () {
	std::unique_lock<std::mutex> lock (barrierMutex);
	barrierCV.wait (lock, [&] {return activitiesNumber == 0;});
}